

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.h
# Opt level: O2

void __thiscall tetgenmesh::freememory(tetgenmesh *this)

{
  tetgenmesh *this_00;
  memorypool *pmVar1;
  arraypool *paVar2;
  
  this_00 = this->bgm;
  if (this_00 != (tetgenmesh *)0x0) {
    freememory(this_00);
    operator_delete(this_00,0x600);
  }
  pmVar1 = this->points;
  if (pmVar1 != (memorypool *)0x0) {
    memorypool::~memorypool(pmVar1);
    operator_delete(pmVar1,0x58);
    if (this->dummypoint != (point)0x0) {
      operator_delete__(this->dummypoint);
    }
  }
  pmVar1 = this->tetrahedrons;
  if (pmVar1 != (memorypool *)0x0) {
    memorypool::~memorypool(pmVar1);
    operator_delete(pmVar1,0x58);
  }
  pmVar1 = this->subfaces;
  if (pmVar1 != (memorypool *)0x0) {
    memorypool::~memorypool(pmVar1);
    operator_delete(pmVar1,0x58);
    pmVar1 = this->subsegs;
    if (pmVar1 != (memorypool *)0x0) {
      memorypool::~memorypool(pmVar1);
    }
    operator_delete(pmVar1,0x58);
  }
  pmVar1 = this->tet2segpool;
  if (pmVar1 != (memorypool *)0x0) {
    memorypool::~memorypool(pmVar1);
    operator_delete(pmVar1,0x58);
    pmVar1 = this->tet2subpool;
    if (pmVar1 != (memorypool *)0x0) {
      memorypool::~memorypool(pmVar1);
    }
    operator_delete(pmVar1,0x58);
  }
  pmVar1 = this->badtetrahedrons;
  if (pmVar1 != (memorypool *)0x0) {
    memorypool::~memorypool(pmVar1);
    operator_delete(pmVar1,0x58);
  }
  pmVar1 = this->badsubfacs;
  if (pmVar1 != (memorypool *)0x0) {
    memorypool::~memorypool(pmVar1);
    operator_delete(pmVar1,0x58);
  }
  pmVar1 = this->badsubsegs;
  if (pmVar1 != (memorypool *)0x0) {
    memorypool::~memorypool(pmVar1);
    operator_delete(pmVar1,0x58);
  }
  paVar2 = this->encseglist;
  if (paVar2 != (arraypool *)0x0) {
    arraypool::~arraypool(paVar2);
    operator_delete(paVar2,0x30);
  }
  paVar2 = this->encshlist;
  if (paVar2 != (arraypool *)0x0) {
    arraypool::~arraypool(paVar2);
    operator_delete(paVar2,0x30);
  }
  pmVar1 = this->flippool;
  if (pmVar1 != (memorypool *)0x0) {
    memorypool::~memorypool(pmVar1);
    operator_delete(pmVar1,0x58);
    paVar2 = this->unflipqueue;
    if (paVar2 != (arraypool *)0x0) {
      arraypool::~arraypool(paVar2);
    }
    operator_delete(paVar2,0x30);
  }
  paVar2 = this->cavetetlist;
  if (paVar2 != (arraypool *)0x0) {
    arraypool::~arraypool(paVar2);
    operator_delete(paVar2,0x30);
    paVar2 = this->cavebdrylist;
    if (paVar2 != (arraypool *)0x0) {
      arraypool::~arraypool(paVar2);
    }
    operator_delete(paVar2,0x30);
    paVar2 = this->caveoldtetlist;
    if (paVar2 != (arraypool *)0x0) {
      arraypool::~arraypool(paVar2);
    }
    operator_delete(paVar2,0x30);
    paVar2 = this->cavetetvertlist;
    if (paVar2 != (arraypool *)0x0) {
      arraypool::~arraypool(paVar2);
    }
    operator_delete(paVar2,0x30);
  }
  paVar2 = this->caveshlist;
  if (paVar2 != (arraypool *)0x0) {
    arraypool::~arraypool(paVar2);
    operator_delete(paVar2,0x30);
    paVar2 = this->caveshbdlist;
    if (paVar2 != (arraypool *)0x0) {
      arraypool::~arraypool(paVar2);
    }
    operator_delete(paVar2,0x30);
    paVar2 = this->cavesegshlist;
    if (paVar2 != (arraypool *)0x0) {
      arraypool::~arraypool(paVar2);
    }
    operator_delete(paVar2,0x30);
    paVar2 = this->cavetetshlist;
    if (paVar2 != (arraypool *)0x0) {
      arraypool::~arraypool(paVar2);
    }
    operator_delete(paVar2,0x30);
    paVar2 = this->cavetetseglist;
    if (paVar2 != (arraypool *)0x0) {
      arraypool::~arraypool(paVar2);
    }
    operator_delete(paVar2,0x30);
    paVar2 = this->caveencshlist;
    if (paVar2 != (arraypool *)0x0) {
      arraypool::~arraypool(paVar2);
    }
    operator_delete(paVar2,0x30);
    paVar2 = this->caveencseglist;
    if (paVar2 != (arraypool *)0x0) {
      arraypool::~arraypool(paVar2);
    }
    operator_delete(paVar2,0x30);
  }
  paVar2 = this->subsegstack;
  if (paVar2 != (arraypool *)0x0) {
    arraypool::~arraypool(paVar2);
    operator_delete(paVar2,0x30);
    paVar2 = this->subfacstack;
    if (paVar2 != (arraypool *)0x0) {
      arraypool::~arraypool(paVar2);
    }
    operator_delete(paVar2,0x30);
    paVar2 = this->subvertstack;
    if (paVar2 != (arraypool *)0x0) {
      arraypool::~arraypool(paVar2);
    }
    operator_delete(paVar2,0x30);
  }
  if (this->idx2facetlist != (int *)0x0) {
    operator_delete__(this->idx2facetlist);
    if (this->facetverticeslist != (point *)0x0) {
      operator_delete__(this->facetverticeslist);
    }
  }
  if (this->segmentendpointslist != (point *)0x0) {
    operator_delete__(this->segmentendpointslist);
  }
  if (this->highordertable != (point *)0x0) {
    operator_delete__(this->highordertable);
  }
  initializetetgenmesh(this);
  return;
}

Assistant:

void freememory()
  {
    if (bgm != NULL) {
      delete bgm;
    }

    if (points != (memorypool *) NULL) {
      delete points;
      delete [] dummypoint;
    }
    if (tetrahedrons != (memorypool *) NULL) {
      delete tetrahedrons;
    }
    if (subfaces != (memorypool *) NULL) {
      delete subfaces;
      delete subsegs;
    }
    if (tet2segpool != NULL) {
      delete tet2segpool;
      delete tet2subpool;
    }

    if (badtetrahedrons) {
      delete badtetrahedrons;
    }
    if (badsubfacs) {
      delete badsubfacs;
    }
    if (badsubsegs) {
      delete badsubsegs;
    }
    if (encseglist) {
      delete encseglist;
    }
    if (encshlist) {
      delete encshlist;
    }

    if (flippool != NULL) {
      delete flippool;
      delete unflipqueue;
    }

    if (cavetetlist != NULL) {
      delete cavetetlist;
      delete cavebdrylist;
      delete caveoldtetlist;
      delete cavetetvertlist;
    }

    if (caveshlist != NULL) {
      delete caveshlist;
      delete caveshbdlist;
      delete cavesegshlist;
      delete cavetetshlist;
      delete cavetetseglist;
      delete caveencshlist;
      delete caveencseglist;
    }

    if (subsegstack != NULL) {
      delete subsegstack;
      delete subfacstack;
      delete subvertstack;
    }

    if (idx2facetlist != NULL) {
      delete [] idx2facetlist;
      delete [] facetverticeslist;
    }

    if (segmentendpointslist != NULL) {
      delete [] segmentendpointslist;
    }

    if (highordertable != NULL) {
      delete [] highordertable;
    }

    initializetetgenmesh();
  }